

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

LY_ERR ly_out_new_clb(ly_write_clb writeclb,void *user_data,ly_out **out)

{
  ly_out *plVar1;
  ly_out **out_local;
  void *user_data_local;
  ly_write_clb writeclb_local;
  
  if (out == (ly_out **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_new_clb");
    writeclb_local._4_4_ = LY_EINVAL;
  }
  else if (writeclb == (ly_write_clb)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","writeclb",
           "ly_out_new_clb");
    writeclb_local._4_4_ = LY_EINVAL;
  }
  else {
    plVar1 = (ly_out *)calloc(1,0x50);
    *out = plVar1;
    if (*out == (ly_out *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_out_new_clb");
      writeclb_local._4_4_ = LY_EMEM;
    }
    else {
      (*out)->type = LY_OUT_CALLBACK;
      ((*out)->method).clb.func = writeclb;
      ((*out)->method).clb.arg = user_data;
      writeclb_local._4_4_ = LY_SUCCESS;
    }
  }
  return writeclb_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_new_clb(ly_write_clb writeclb, void *user_data, struct ly_out **out)
{
    LY_CHECK_ARG_RET(NULL, out, writeclb, LY_EINVAL);

    *out = calloc(1, sizeof **out);
    LY_CHECK_ERR_RET(!*out, LOGMEM(NULL), LY_EMEM);

    (*out)->type = LY_OUT_CALLBACK;
    (*out)->method.clb.func = writeclb;
    (*out)->method.clb.arg = user_data;

    return LY_SUCCESS;
}